

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O3

QString * __thiscall
Mustache::QtVariantContext::eval
          (QString *__return_storage_ptr__,QtVariantContext *this,QString *key,QString *_template,
          Renderer *renderer)

{
  char cVar1;
  bool bVar2;
  QMetaType QVar3;
  undefined8 uVar4;
  anon_union_24_3_e3d07ef4_for_data *paVar5;
  QVariant fn;
  undefined8 in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  _Manager_type local_68;
  _Invoker_type p_Stack_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  byte local_40;
  QtVariantContext *local_38;
  Renderer *local_30;
  
  paVar5 = &local_58;
  value((QVariant *)paVar5,this,key);
  cVar1 = ::QVariant::isNull();
  if (cVar1 == '\0') {
    bVar2 = operator==((QMetaType)in_stack_ffffffffffffff90,(QMetaType)in_stack_ffffffffffffff88);
    if (bVar2) {
      if ((local_40 & 1) != 0) {
        paVar5 = (anon_union_24_3_e3d07ef4_for_data *)
                 (local_58.shared + *(int *)(local_58.shared + 4));
      }
      std::function<QString_(const_QString_&,_Mustache::Renderer_*,_Mustache::Context_*)>::function
                ((function<QString_(const_QString_&,_Mustache::Renderer_*,_Mustache::Context_*)> *)
                 &stack0xffffffffffffff88,
                 (function<QString_(const_QString_&,_Mustache::Renderer_*,_Mustache::Context_*)> *)
                 paVar5);
    }
    else {
      local_68 = (_Manager_type)0x0;
      p_Stack_60 = (_Invoker_type)0x0;
      paVar5 = &local_58;
      QVar3.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if ((local_40 & 1) != 0) {
        paVar5 = (anon_union_24_3_e3d07ef4_for_data *)
                 (local_58.shared + *(int *)(local_58.shared + 4));
      }
      QMetaType::convert(QVar3,paVar5,(QMetaType)0x123668,&stack0xffffffffffffff88);
    }
    local_38 = this;
    local_30 = renderer;
    if (local_68 == (_Manager_type)0x0) {
      uVar4 = std::__throw_bad_function_call();
      __clang_call_terminate(uVar4);
    }
    (*p_Stack_60)(__return_storage_ptr__,(_Any_data *)&stack0xffffffffffffff88,_template,&local_30,
                  (Context **)&local_38);
    if (local_68 != (_Manager_type)0x0) {
      (*local_68)((_Any_data *)&stack0xffffffffffffff88,(_Any_data *)&stack0xffffffffffffff88,
                  __destroy_functor);
    }
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  ::QVariant::~QVariant((QVariant *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

QString QtVariantContext::eval(const QString& key, const QString& _template, Renderer* renderer)
{
	QVariant fn = value(key);
	if (fn.isNull()) {
		return QString();
	}
	return fn.value<fn_t>()(_template, renderer, this);
}